

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_headers_parser.h
# Opt level: O1

void __thiscall cppcms::impl::cgi_headers_parser::add_header(cgi_headers_parser *this)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  p;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  _List_node_base *p_Var5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end;
  string local_70;
  string local_50;
  
  _Var4._M_current = (this->header_)._M_dataplus._M_p;
  end._M_current = _Var4._M_current + ((this->header_)._M_string_length - 2);
  begin = http::protocol::skip_ws<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    (_Var4,end);
  p = http::protocol::tocken<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(begin,end);
  _Var3 = http::protocol::skip_ws<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(p,end);
  _Var4._M_current = end._M_current;
  if (_Var3._M_current != end._M_current) {
    _Var4 = http::protocol::skip_ws<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                      (_Var3._M_current + 1,end);
  }
  if ((_Var3._M_current < end._M_current && p._M_current != begin._M_current) &&
     (*_Var3._M_current == ':')) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((string *)&local_70,begin._M_current,p._M_current);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((string *)&local_50,_Var4._M_current,end._M_current);
    response_headers::add_header(&this->h_,&local_70,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_001c6ab7;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_70,(ulong)this);
    p_Var5 = (_List_node_base *)operator_new(0x30);
    p_Var5[1]._M_next = p_Var5 + 2;
    paVar2 = &local_70.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == paVar2) {
      p_Var5[2]._M_next =
           (_List_node_base *)
           CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,local_70.field_2._M_local_buf[0]);
      p_Var5[2]._M_prev = (_List_node_base *)local_70.field_2._8_8_;
    }
    else {
      p_Var5[1]._M_next = (_List_node_base *)local_70._M_dataplus._M_p;
      p_Var5[2]._M_next =
           (_List_node_base *)
           CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,local_70.field_2._M_local_buf[0]);
    }
    p_Var5[1]._M_prev = (_List_node_base *)local_70._M_string_length;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)paVar2;
    std::__detail::_List_node_base::_M_hook(p_Var5);
    psVar1 = &(this->h_).added_headers_.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == paVar2) goto LAB_001c6ab7;
  }
  operator_delete(local_70._M_dataplus._M_p);
LAB_001c6ab7:
  (this->header_)._M_string_length = 0;
  *(this->header_)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void add_header()
	{
		auto start = header_.begin();
		auto end = start + header_.size() - 2;
		using namespace cppcms::http::protocol;
		start = skip_ws(start,end);
		auto key_end = tocken(start,end);
		auto colon=skip_ws(key_end,end);
		auto value_start=(colon != end) ? skip_ws(colon+1,end) : end;
		if(key_end != start && colon < end && *colon == ':')
			h_.add_header(std::string(start,key_end),std::string(value_start,end));
		else
			h_.add_header(header_.substr(0,header_.size()-2));
		header_.clear();
	}